

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O2

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig(cmScriptGenerator *this,ostream *os,Indent indent)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer config;
  string config_test;
  string local_50;
  
  config = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (config != pbVar1) {
    bVar2 = true;
    for (; config != pbVar1; config = config + 1) {
      bVar3 = GeneratesForConfig(this,config);
      if (bVar3) {
        CreateConfigTest(&local_50,this,config);
        poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        pcVar6 = "elseif(";
        if (bVar2) {
          pcVar6 = "if(";
        }
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        std::operator<<(poVar5,")\n");
        (*this->_vptr_cmScriptGenerator[5])(this,os,config,(ulong)(indent.Level + 2U));
        std::__cxx11::string::~string((string *)&local_50);
        bVar2 = false;
      }
    }
    if (!bVar2) {
      iVar4 = (*this->_vptr_cmScriptGenerator[7])(this);
      if ((char)iVar4 != '\0') {
        poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        std::operator<<(poVar5,"else()\n");
        (*this->_vptr_cmScriptGenerator[6])(this,os,(ulong)(indent.Level + 2U));
      }
      poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar5,"endif()\n");
    }
    return;
  }
  GenerateScriptActionsOnce(this,os,indent);
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent indent)
{
  if (this->ConfigurationTypes->empty()) {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
  } else {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for (std::string const& cfgType : *this->ConfigurationTypes) {
      if (this->GeneratesForConfig(cfgType)) {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(cfgType);
        os << indent << (first ? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, cfgType, indent.Next());
        first = false;
      }
    }
    if (!first) {
      if (this->NeedsScriptNoConfig()) {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
      }
      os << indent << "endif()\n";
    }
  }
}